

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

char * cppcms::http::response::status_to_string(int status)

{
  int status_local;
  char *local_8;
  
  if (status == 100) {
    local_8 = "Continue";
  }
  else if (status == 0x65) {
    local_8 = "Switching Protocols";
  }
  else if (status == 200) {
    local_8 = "OK";
  }
  else if (status == 0xc9) {
    local_8 = "Created";
  }
  else if (status == 0xca) {
    local_8 = "Accepted";
  }
  else if (status == 0xcb) {
    local_8 = "Non-Authoritative Information";
  }
  else if (status == 0xcc) {
    local_8 = "No Content";
  }
  else if (status == 0xcd) {
    local_8 = "Reset Content";
  }
  else if (status == 0xce) {
    local_8 = "Partial Content";
  }
  else if (status == 300) {
    local_8 = "Multiple Choices";
  }
  else if (status == 0x12d) {
    local_8 = "Moved Permanently";
  }
  else if (status == 0x12e) {
    local_8 = "Found";
  }
  else if (status == 0x12f) {
    local_8 = "See Other";
  }
  else if (status == 0x130) {
    local_8 = "Not Modified";
  }
  else if (status == 0x131) {
    local_8 = "Use Proxy";
  }
  else if (status == 0x133) {
    local_8 = "Temporary Redirect";
  }
  else if (status == 400) {
    local_8 = "Bad Request";
  }
  else if (status == 0x191) {
    local_8 = "Unauthorized";
  }
  else if (status == 0x192) {
    local_8 = "Payment Required";
  }
  else if (status == 0x193) {
    local_8 = "Forbidden";
  }
  else if (status == 0x194) {
    local_8 = "Not Found";
  }
  else if (status == 0x195) {
    local_8 = "Method Not Allowed";
  }
  else if (status == 0x196) {
    local_8 = "Not Acceptable";
  }
  else if (status == 0x197) {
    local_8 = "Proxy Authentication Required";
  }
  else if (status == 0x198) {
    local_8 = "Request Time-out";
  }
  else if (status == 0x199) {
    local_8 = "Conflict";
  }
  else if (status == 0x19a) {
    local_8 = "Gone";
  }
  else if (status == 0x19b) {
    local_8 = "Length Required";
  }
  else if (status == 0x19c) {
    local_8 = "Precondition Failed";
  }
  else if (status == 0x19d) {
    local_8 = "Request Entity Too Large";
  }
  else if (status == 0x19e) {
    local_8 = "Request-URI Too Large";
  }
  else if (status == 0x19f) {
    local_8 = "Unsupported Media Type";
  }
  else if (status == 0x1a0) {
    local_8 = "Requested range not satisfiable";
  }
  else if (status == 0x1a1) {
    local_8 = "Expectation Failed";
  }
  else if (status == 500) {
    local_8 = "Internal Server Error";
  }
  else if (status == 0x1f5) {
    local_8 = "Not Implemented";
  }
  else if (status == 0x1f6) {
    local_8 = "Bad Gateway";
  }
  else if (status == 0x1f7) {
    local_8 = "Service Unavailable";
  }
  else if (status == 0x1f8) {
    local_8 = "Gateway Time-out";
  }
  else if (status == 0x1f9) {
    local_8 = "HTTP Version not supported";
  }
  else {
    local_8 = "Unknown";
  }
  return local_8;
}

Assistant:

char const *response::status_to_string(int status)
{
	switch(status) {
	case 100: return "Continue";
 	case 101: return "Switching Protocols";
 	case 200: return "OK";
 	case 201: return "Created";
 	case 202: return "Accepted";
 	case 203: return "Non-Authoritative Information";
 	case 204: return "No Content";
 	case 205: return "Reset Content";
 	case 206: return "Partial Content";
 	case 300: return "Multiple Choices";
 	case 301: return "Moved Permanently";
 	case 302: return "Found";
 	case 303: return "See Other";
 	case 304: return "Not Modified";
 	case 305: return "Use Proxy";
 	case 307: return "Temporary Redirect";
 	case 400: return "Bad Request";
 	case 401: return "Unauthorized";
 	case 402: return "Payment Required";
 	case 403: return "Forbidden";
 	case 404: return "Not Found";
 	case 405: return "Method Not Allowed";
 	case 406: return "Not Acceptable";
 	case 407: return "Proxy Authentication Required";
 	case 408: return "Request Time-out";
 	case 409: return "Conflict";
 	case 410: return "Gone";
 	case 411: return "Length Required";
 	case 412: return "Precondition Failed";
 	case 413: return "Request Entity Too Large";
 	case 414: return "Request-URI Too Large";
 	case 415: return "Unsupported Media Type";
 	case 416: return "Requested range not satisfiable";
 	case 417: return "Expectation Failed";
 	case 500: return "Internal Server Error";
 	case 501: return "Not Implemented";
 	case 502: return "Bad Gateway";
 	case 503: return "Service Unavailable";
 	case 504: return "Gateway Time-out";
 	case 505: return "HTTP Version not supported";
	default:  return "Unknown";
	}
}